

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_api.c
# Opt level: O0

MPP_RET h264d_prepare(void *decoder,MppPacket pkt,HalDecTask *task)

{
  H264dInputCtx_t *p_Inp_00;
  RK_U32 RVar1;
  RK_S64 RVar2;
  size_t sVar3;
  RK_U8 *pRVar4;
  bool bVar5;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar6;
  undefined8 in_stack_ffffffffffffffa0;
  undefined4 uVar7;
  bool local_49;
  RK_U8 *pdata;
  H264_DecCtx_t *p_Dec;
  H264dInputCtx_t *p_Inp;
  MPP_RET ret;
  HalDecTask *task_local;
  MppPacket pkt_local;
  void *decoder_local;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  uVar7 = (undefined4)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  if (((decoder == (void *)0x0) && (pkt == (MppPacket)0x0)) && (task == (HalDecTask *)0x0)) {
    if ((h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_api","input empty(%d).\n",(char *)0x0,0x218);
    }
  }
  else {
    p_Inp_00 = *(H264dInputCtx_t **)((long)decoder + 0x38);
    if (p_Inp_00->has_get_eos == '\0') {
      p_Inp_00->in_pkt = pkt;
      RVar2 = mpp_packet_get_pts(pkt);
      p_Inp_00->in_pts = RVar2;
      RVar2 = mpp_packet_get_dts(pkt);
      p_Inp_00->in_dts = RVar2;
      sVar3 = mpp_packet_get_length(pkt);
      p_Inp_00->in_length = sVar3;
      RVar1 = mpp_packet_get_eos(pkt);
      p_Inp_00->pkt_eos = RVar1;
      pRVar4 = (RK_U8 *)mpp_packet_get_pos(pkt);
      p_Inp_00->in_buf = pRVar4;
      if ((p_Inp_00->pkt_eos != 0) && (p_Inp_00->in_length < 4)) {
        p_Inp_00->has_get_eos = '\x01';
        p_Inp_00->in_buf = (RK_U8 *)0x0;
        p_Inp_00->in_length = 0;
        mpp_packet_set_length(p_Inp_00->in_pkt,0);
        (task->flags).val = (task->flags).val & 0xfffffffffffffffe | (ulong)p_Inp_00->pkt_eos & 1;
      }
      if (0xa00000 < p_Inp_00->in_length) {
        if ((h264d_debug & 1) != 0) {
          _mpp_log_l(4,"h264d_api",
                     "[pkt_in_timeUs] input error, stream too large, pts=%lld, eos=%d, len=%d, pkt_no=%d"
                     ,(char *)0x0,p_Inp_00->in_pts,(ulong)p_Inp_00->pkt_eos,p_Inp_00->in_length,
                     CONCAT44(uVar7,*(undefined4 *)(*(long *)((long)decoder + 0x48) + 0xcf0)));
        }
        mpp_packet_set_length(pkt,0);
        return MPP_NOK;
      }
      RVar1 = mpp_packet_get_flag(pkt);
      if ((RVar1 & 2) != 0) {
        local_49 = false;
        if (3 < p_Inp_00->in_length) {
          local_49 = *p_Inp_00->in_buf == '\x01';
        }
        p_Inp_00->is_nalff = local_49;
        _mpp_log_l(4,"h264d_api","is_avcC=%d\n",(char *)0x0,(ulong)p_Inp_00->is_nalff);
        if (p_Inp_00->is_nalff != '\0') {
          parse_prepare_avcC_header(p_Inp_00,*(H264dCurCtx_t **)((long)decoder + 0x40));
          return MPP_OK;
        }
      }
      if ((h264d_debug & 0x10) != 0) {
        _mpp_log_l(4,"h264d_api",
                   "[pkt_in_timeUs] is_avcC=%d, in_pts=%lld, pkt_eos=%d, len=%d, pkt_no=%d",
                   (char *)0x0,(ulong)p_Inp_00->is_nalff,p_Inp_00->in_pts,
                   CONCAT44(uVar6,p_Inp_00->pkt_eos),p_Inp_00->in_length,
                   *(undefined4 *)(*(long *)((long)decoder + 0x48) + 0xcf0));
      }
      if (p_Inp_00->is_nalff == '\0') {
        fwrite_stream_to_file(p_Inp_00,p_Inp_00->in_buf,(RK_U32)p_Inp_00->in_length);
        do {
          if (*(int *)(*(long *)((long)decoder + 0x78) + 0x24) == 0) {
            parse_prepare_fast(p_Inp_00,*(H264dCurCtx_t **)((long)decoder + 0x40));
          }
          else {
            parse_prepare(p_Inp_00,*(H264dCurCtx_t **)((long)decoder + 0x40));
          }
          task->valid = (uint)p_Inp_00->task_valid;
          sVar3 = mpp_packet_get_length(pkt);
          bVar5 = false;
          if (sVar3 != 0) {
            bVar5 = task->valid == 0;
          }
        } while (bVar5);
      }
      else {
        parse_prepare_avcC_data(p_Inp_00,*(H264dCurCtx_t **)((long)decoder + 0x40));
        task->valid = (uint)p_Inp_00->task_valid;
      }
      if (p_Inp_00->in_length < 4) {
        (task->flags).val = (task->flags).val & 0xfffffffffffffffe | (ulong)p_Inp_00->pkt_eos & 1;
      }
      if (task->valid == 0) {
        task->input_packet = (MppPacket)0x0;
        if ((p_Inp_00->pkt_eos != 0) && (p_Inp_00->in_length < 4)) {
          h264d_flush_dpb_eos((H264_DecCtx_t *)decoder);
        }
      }
      else {
        memset((void *)(*(long *)(*(long *)((long)decoder + 0x30) + 0xbb0) +
                       (ulong)*(uint *)(*(long *)((long)decoder + 0x30) + 0xbbc)),0,
               (ulong)((*(int *)(*(long *)((long)decoder + 0x30) + 0xbbc) + 0xfU & 0xfffffff0) -
                      *(int *)(*(long *)((long)decoder + 0x30) + 0xbbc)));
        mpp_packet_set_data(*(MppPacket *)((long)decoder + 0x90),
                            *(void **)(*(long *)((long)decoder + 0x30) + 0xbb0));
        mpp_packet_set_length
                  (*(MppPacket *)((long)decoder + 0x90),
                   (ulong)(*(int *)(*(long *)((long)decoder + 0x30) + 0xbbc) + 0xfU & 0xfffffff0));
        mpp_packet_set_size(*(MppPacket *)((long)decoder + 0x90),
                            (ulong)*(uint *)(*(long *)((long)decoder + 0x30) + 3000));
        task->input_packet = *(MppPacket *)((long)decoder + 0x90);
      }
    }
    else {
      mpp_packet_set_length(pkt,0);
      RVar1 = mpp_packet_get_eos(pkt);
      (task->flags).val = (task->flags).val & 0xfffffffffffffffe | (ulong)RVar1 & 1;
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET h264d_prepare(void *decoder, MppPacket pkt, HalDecTask *task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dInputCtx_t *p_Inp = NULL;
    H264_DecCtx_t   *p_Dec = (H264_DecCtx_t *)decoder;

    INP_CHECK(ret, !decoder && !pkt && !task);

    p_Inp = p_Dec->p_Inp;
    if (p_Inp->has_get_eos) {
        mpp_packet_set_length(pkt, 0);
        task->flags.eos = mpp_packet_get_eos(pkt);
        goto __RETURN;
    }
    p_Inp->in_pkt = pkt;
    p_Inp->in_pts = mpp_packet_get_pts(pkt);
    p_Inp->in_dts = mpp_packet_get_dts(pkt);
    p_Inp->in_length = mpp_packet_get_length(pkt);
    p_Inp->pkt_eos = mpp_packet_get_eos(pkt);
    p_Inp->in_buf = (RK_U8 *)mpp_packet_get_pos(pkt);

    if (p_Inp->pkt_eos && p_Inp->in_length < 4) {
        p_Inp->has_get_eos = 1;
        p_Inp->in_buf = NULL;
        p_Inp->in_length = 0;
        mpp_packet_set_length(p_Inp->in_pkt, 0);
        task->flags.eos = p_Inp->pkt_eos;
    }

    if (p_Inp->in_length > MAX_STREM_IN_SIZE) {
        H264D_ERR("[pkt_in_timeUs] input error, stream too large, pts=%lld, eos=%d, len=%d, pkt_no=%d",
                  p_Inp->in_pts, p_Inp->pkt_eos, p_Inp->in_length, p_Dec->p_Vid->g_framecnt);
        mpp_packet_set_length(pkt, 0);
        ret = MPP_NOK;
        goto __FAILED;
    }
    //!< avcC stream
    if (mpp_packet_get_flag(pkt) & MPP_PACKET_FLAG_EXTRA_DATA) {
        RK_U8 *pdata = p_Inp->in_buf;

        p_Inp->is_nalff = (p_Inp->in_length > 3) && (pdata[0] == 1);
        mpp_log("is_avcC=%d\n", p_Inp->is_nalff);
        if (p_Inp->is_nalff) {
            (ret = parse_prepare_avcC_header(p_Inp, p_Dec->p_Cur));
            goto __RETURN;
        }
    }
    H264D_DBG(H264D_DBG_INPUT, "[pkt_in_timeUs] is_avcC=%d, in_pts=%lld, pkt_eos=%d, len=%d, pkt_no=%d",
              p_Inp->is_nalff, p_Inp->in_pts, p_Inp->pkt_eos, p_Inp->in_length, p_Dec->p_Vid->g_framecnt);
    if (p_Inp->is_nalff) {
        (ret = parse_prepare_avcC_data(p_Inp, p_Dec->p_Cur));
        task->valid = p_Inp->task_valid;  //!< prepare valid flag
    } else  {
        fwrite_stream_to_file(p_Inp, p_Inp->in_buf, (RK_U32)p_Inp->in_length);
        do {
            if (p_Dec->cfg->base.split_parse) {
                ret = parse_prepare(p_Inp, p_Dec->p_Cur);
            } else {
                ret = parse_prepare_fast(p_Inp, p_Dec->p_Cur);
            }
            task->valid = p_Inp->task_valid;  //!< prepare valid flag
        } while (mpp_packet_get_length(pkt) && !task->valid);
    }
    if (p_Inp->in_length < 4)
        task->flags.eos = p_Inp->pkt_eos;
    if (task->valid) {
        memset(p_Dec->dxva_ctx->bitstream + p_Dec->dxva_ctx->strm_offset, 0,
               MPP_ALIGN(p_Dec->dxva_ctx->strm_offset, 16) - p_Dec->dxva_ctx->strm_offset);
        mpp_packet_set_data(p_Dec->task_pkt, p_Dec->dxva_ctx->bitstream);
        mpp_packet_set_length(p_Dec->task_pkt, MPP_ALIGN(p_Dec->dxva_ctx->strm_offset, 16));
        mpp_packet_set_size(p_Dec->task_pkt, p_Dec->dxva_ctx->max_strm_size);
        task->input_packet = p_Dec->task_pkt;
    } else {
        task->input_packet = NULL;
        /*
         * During split_parse, the empty EOS will endcode and decode the
         * last complete packet.
         * When sending EOS in split mode, dpb can not be flushed
         * before split process.
         */
        if (p_Inp->pkt_eos && p_Inp->in_length < 4)
            h264d_flush_dpb_eos(p_Dec);
    }
__RETURN:

    return ret = MPP_OK;
__FAILED:
    return ret;
}